

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O0

void __thiscall
ParticleTest_GetGamma_Test<pica::Particle<(pica::Dimension)3>_>::TestBody
          (ParticleTest_GetGamma_Test<pica::Particle<(pica::Dimension)3>_> *this)

{
  double *pdVar1;
  bool bVar2;
  char *message;
  AssertHelper *this_00;
  Particle<(pica::Dimension)3> *pPVar3;
  Particle<(pica::Dimension)3> *in_RDI;
  Particle<(pica::Dimension)3> *this_01;
  double dVar4;
  char *file;
  double extraout_XMM0_Qa;
  FP FVar5;
  double dVar6;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  GammaType expectedGamma;
  ParticleType particle;
  AssertHelper *in_stack_fffffffffffffef0;
  char *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  int iVar7;
  Type type;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *in_stack_ffffffffffffff70;
  double *in_stack_ffffffffffffff80;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  Particle<(pica::Dimension)3> local_50;
  
  iVar7 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>::randomParticle
            (in_stack_ffffffffffffff70);
  pPVar3 = &local_50;
  pica::Particle<(pica::Dimension)3>::getMomentum(in_RDI);
  dVar4 = pica::Vector3<double>::norm2((Vector3<double> *)&stack0xffffffffffffff90);
  this_01 = &local_50;
  file = (char *)pica::Particle<(pica::Dimension)3>::getMass(this_01);
  pica::Constants<double>::c(this_01,pPVar3);
  FVar5 = pica::sqr((double)file * extraout_XMM0_Qa);
  dVar6 = sqrt(dVar4 / FVar5 + 1.0);
  type = (Type)((ulong)dVar4 >> 0x20);
  (in_RDI->p).x = 1e-12;
  pdVar1 = &(in_RDI->position).z;
  if (ABS(dVar6) < *pdVar1 || ABS(dVar6) == *pdVar1) {
    pica::Particle<(pica::Dimension)3>::getGamma(&local_50);
    testing::internal::CmpHelperLE<double,double>
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
               (double *)in_stack_ffffffffffffff88.ptr_,in_stack_ffffffffffffff80);
    bVar2 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xffffffffffffff40);
    if (!bVar2) {
      testing::Message::Message((Message *)in_RDI);
      this_00 = (AssertHelper *)
                testing::AssertionResult::failure_message((AssertionResult *)0x203be9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_RDI,type,file,iVar7,in_stack_ffffffffffffff00);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 (Message *)in_stack_ffffffffffffff48.ptr_);
      testing::internal::AssertHelper::~AssertHelper(this_00);
      testing::Message::~Message((Message *)0x203c37);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x203ca0);
  }
  else {
    pica::Particle<(pica::Dimension)3>::getGamma(&local_50);
    iVar7 = (int)((ulong)dVar6 >> 0x20);
    testing::internal::CmpHelperLE<double,double>
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
               (double *)in_stack_ffffffffffffff88.ptr_,in_stack_ffffffffffffff80);
    bVar2 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xffffffffffffff80);
    if (!bVar2) {
      testing::Message::Message((Message *)in_RDI);
      message = testing::AssertionResult::failure_message((AssertionResult *)0x203a75);
      testing::internal::AssertHelper::AssertHelper((AssertHelper *)in_RDI,type,file,iVar7,message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 (Message *)in_stack_ffffffffffffff48.ptr_);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffef0);
      testing::Message::~Message((Message *)0x203ac9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x203b38);
  }
  return;
}

Assistant:

TYPED_TEST(ParticleTest, GetGamma)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::GammaType GammaType;

    ParticleType particle = this->randomParticle();
    GammaType expectedGamma = sqrt(static_cast<GammaType>(1.0) + particle.getMomentum().norm2() /
        sqr(particle.getMass() * Constants<GammaType>::c()));
    this->maxRelativeError = 1e-12;
    ASSERT_NEAR_FP(expectedGamma, particle.getGamma());
}